

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowOpts.cpp
# Opt level: O1

void __thiscall wasm::DataFlowOpts::optimizeExprToConstant(DataFlowOpts *this,Node *node)

{
  Expression *pEVar1;
  pointer ppNVar2;
  Expression **ppEVar3;
  Const *pCVar4;
  undefined1 reuse;
  ulong in_RCX;
  Expression *pEVar5;
  ulong uVar6;
  string_view sVar7;
  Name name;
  undefined1 local_5a8 [8];
  Module temp;
  Literal local_c8;
  Literal local_b0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_98;
  bool local_78;
  string local_70;
  HeapType local_50;
  Builder local_48;
  DataFlowOpts *local_40;
  Function *local_38;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> tempFunc;
  
  local_40 = this;
  if (node->type != Expr) {
    __assert_fail("node->isExpr()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/DataFlowOpts.cpp"
                  ,0x75,"void wasm::DataFlowOpts::optimizeExprToConstant(DataFlow::Node *)");
  }
  if (((node->field_1).expr)->_id == ConstId) {
    __assert_fail("!node->isConst()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/DataFlowOpts.cpp"
                  ,0x76,"void wasm::DataFlowOpts::optimizeExprToConstant(DataFlow::Node *)");
  }
  pEVar1 = (node->field_1).expr;
  ppNVar2 = (node->values).
            super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((node->values).
      super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppNVar2) {
    uVar6 = 0;
    do {
      if ((ppNVar2[uVar6]->type == Expr) && (((ppNVar2[uVar6]->field_1).expr)->_id == ConstId)) {
        ppEVar3 = getIndexPointer(local_40,pEVar1,(Index)uVar6);
        pEVar5 = ((node->values).
                  super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar6]->field_1).expr;
        if (pEVar5->_id != ConstId) {
          pEVar5 = (Expression *)0x0;
        }
        local_5a8 = (undefined1  [8])
                    (local_40->
                    super_WalkerPass<wasm::PostWalker<wasm::DataFlowOpts,_wasm::Visitor<wasm::DataFlowOpts,_void>_>_>
                    ).super_PostWalker<wasm::DataFlowOpts,_wasm::Visitor<wasm::DataFlowOpts,_void>_>
                    .super_Walker<wasm::DataFlowOpts,_wasm::Visitor<wasm::DataFlowOpts,_void>_>.
                    currModule;
        Literal::Literal(&local_c8,(Literal *)(pEVar5 + 1));
        pCVar4 = Builder::makeConst((Builder *)local_5a8,&local_c8);
        *ppEVar3 = (Expression *)pCVar4;
        Literal::~Literal(&local_c8);
      }
      uVar6 = (ulong)((Index)uVar6 + 1);
      ppNVar2 = (node->values).
                super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      in_RCX = (long)(node->values).
                     super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar2 >> 3;
    } while (uVar6 < in_RCX);
  }
  reuse = (undefined1)in_RCX;
  Module::Module((Module *)local_5a8);
  sVar7 = IString::interned((IString *)0x4,(string_view)ZEXT816(0xdd9d13),(bool)reuse);
  HeapType::HeapType(&local_50,(Signature)ZEXT816(0));
  temp.tagsMap._M_h._M_single_bucket = (__node_base_ptr)0x0;
  name.super_IString.str._M_str = (char *)sVar7._M_len;
  name.super_IString.str._M_len = (size_t)&local_38;
  Builder::makeFunction
            (name,(HeapType)sVar7._M_str,
             (vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_50.id,
             (Expression *)&temp.tagsMap._M_h._M_single_bucket);
  if (temp.tagsMap._M_h._M_single_bucket != (__node_base_ptr)0x0) {
    operator_delete(temp.tagsMap._M_h._M_single_bucket,-(long)temp.tagsMap._M_h._M_single_bucket);
  }
  temp.tagsMap._M_h._M_single_bucket = (__node_base_ptr)&PTR__PassRunner_01091270;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"precompute","");
  local_78 = false;
  PassRunner::add((PassRunner *)&temp.tagsMap._M_h._M_single_bucket,&local_70,
                  (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_98);
  if (local_78 == true) {
    local_78 = false;
    if (local_98._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_98._M_value + 0x10)) {
      operator_delete((void *)local_98._M_value._M_dataplus._M_p,local_98._16_8_ + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  PassRunner::runOnFunction((PassRunner *)&temp.tagsMap._M_h._M_single_bucket,local_38);
  pEVar1 = local_38->body;
  if (pEVar1->_id == ConstId) {
    local_48.wasm =
         (local_40->
         super_WalkerPass<wasm::PostWalker<wasm::DataFlowOpts,_wasm::Visitor<wasm::DataFlowOpts,_void>_>_>
         ).super_PostWalker<wasm::DataFlowOpts,_wasm::Visitor<wasm::DataFlowOpts,_void>_>.
         super_Walker<wasm::DataFlowOpts,_wasm::Visitor<wasm::DataFlowOpts,_void>_>.currModule;
    if (pEVar1->_id != ConstId) {
      __assert_fail("int(_id) == int(T::SpecificId)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                    ,0x31b,"T *wasm::Expression::cast() [T = wasm::Const]");
    }
    Literal::Literal(&local_b0,(Literal *)(pEVar1 + 1));
    pCVar4 = Builder::makeConst(&local_48,&local_b0);
    (node->field_1).expr = (Expression *)pCVar4;
    Literal::~Literal(&local_b0);
    if ((node->type != Expr) || (((node->field_1).expr)->_id != ConstId)) {
      __assert_fail("node->isConst()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/DataFlowOpts.cpp"
                    ,0x9c,"void wasm::DataFlowOpts::optimizeExprToConstant(DataFlow::Node *)");
    }
    DataFlow::Users::stopUsingValues(&local_40->nodeUsers,node);
    ppNVar2 = (node->values).
              super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((node->values).
        super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppNVar2) {
      (node->values).
      super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppNVar2;
    }
    replaceAllUsesWith(local_40,node,node);
  }
  PassRunner::~PassRunner((PassRunner *)&temp.tagsMap._M_h._M_single_bucket);
  if (local_38 != (Function *)0x0) {
    std::default_delete<wasm::Function>::operator()
              ((default_delete<wasm::Function> *)&local_38,local_38);
  }
  Module::~Module((Module *)local_5a8);
  return;
}

Assistant:

void optimizeExprToConstant(DataFlow::Node* node) {
    assert(node->isExpr());
    assert(!node->isConst());
    // std::cout << "will optimize an Expr of all constant inputs. before" <<
    //              '\n';
    // dump(node, std::cout);
    auto* expr = node->expr;
    // First, note that some of the expression's children may be
    // local.gets that we inferred during SSA analysis as constant.
    // We can apply those now.
    for (Index i = 0; i < node->values.size(); i++) {
      if (node->values[i]->isConst()) {
        auto* currp = getIndexPointer(expr, i);
        // Directly represent it as a constant. (Note that it may already be
        // a constant, but for now to avoid corner cases just replace them
        // all here.)
        auto* c = node->values[i]->expr->dynCast<Const>();
        *currp = Builder(*getModule()).makeConst(c->value);
      }
    }
    // Now we know that all our DataFlow inputs are constant, and all
    // our Binaryen IR representations of them are constant too. RUn
    // precompute, which will transform the expression into a constanat.
    Module temp;
    // XXX we should copy expr here, in principle, and definitely will need to
    //     when we do arbitrarily regenerated expressions
    std::unique_ptr<Function> tempFunc(Builder(temp).makeFunction(
      "temp", Signature(Type::none, Type::none), {}, expr));
    PassRunner runner(&temp);
    runner.setIsNested(true);
    runner.add("precompute");
    runner.runOnFunction(tempFunc.get());
    // Get the optimized thing
    auto* result = tempFunc->body;
    // It may not be a constant, e.g. 0 / 0 does not optimize to 0
    if (!result->is<Const>()) {
      return;
    }
    // All good, copy it.
    node->expr = Builder(*getModule()).makeConst(result->cast<Const>()->value);
    assert(node->isConst());
    // We no longer have values, and so do not use anything.
    nodeUsers.stopUsingValues(node);
    node->values.clear();
    // Our contents changed, update our users.
    replaceAllUsesWith(node, node);
  }